

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalStructInference.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_226::GlobalStructInference::~GlobalStructInference(GlobalStructInference *this)

{
  ~GlobalStructInference(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

bool requiresNonNullableLocalFixups() override { return false; }